

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlValidateQName(xmlChar *value,int space)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  byte bVar6;
  xmlChar *cur;
  int l;
  int local_34;
  byte *pbVar5;
  
  if (value == (xmlChar *)0x0) {
    return -1;
  }
  pbVar4 = value;
  if (space == 0) {
    bVar6 = *value;
  }
  else {
    while( true ) {
      bVar6 = *pbVar4;
      if ((0x20 < (ulong)bVar6) || ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) break;
      pbVar4 = pbVar4 + 1;
    }
  }
  if (((byte)(bVar6 + 0x9f) < 0x1a) || (bVar6 == 0x5f || (byte)(bVar6 + 0xbf) < 0x1a)) {
    do {
      do {
        pbVar5 = pbVar4;
        pbVar4 = pbVar5 + 1;
        bVar6 = *pbVar4;
      } while ((byte)(bVar6 - 0x30) < 10);
    } while ((((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) || (bVar6 - 0x2d < 2)) || (bVar6 == 0x5f));
    if (bVar6 == 0x3a) {
      bVar6 = pbVar5[2];
      if ((0x19 < (byte)(bVar6 + 0x9f)) && (bVar6 != 0x5f && 0x19 < (byte)(bVar6 + 0xbf)))
      goto LAB_00144e65;
      pbVar4 = pbVar5 + 3;
      while (((bVar6 = *pbVar4, (byte)(bVar6 - 0x30) < 10 || ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a))
             || ((bVar6 - 0x2d < 0x33 &&
                 ((0x4000000000003U >> ((ulong)(bVar6 - 0x2d) & 0x3f) & 1) != 0))))) {
        pbVar4 = pbVar4 + 1;
      }
    }
    if (space != 0) {
      while ((pbVar4 = pbVar4 + 1, bVar6 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0))) {
        bVar6 = *pbVar4;
      }
    }
    if (bVar6 == 0) {
      return 0;
    }
  }
LAB_00144e65:
  _l = in_RAX;
  uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
  if (space == 0) {
    if ((int)uVar1 < 0x100) {
LAB_00144ec0:
      if ((0x16 < uVar1 - 0xc0) &&
         ((((0x19 < (uVar1 & 0xffffffdf) - 0x41 && (uVar1 != 0x5f)) && ((int)uVar1 < 0xf8)) &&
          (0x1e < uVar1 - 0xd8)))) {
        return 1;
      }
      goto LAB_00144f40;
    }
  }
  else {
    while ((int)uVar1 < 0x100) {
      if ((0x20 < uVar1) || ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) goto LAB_00144ec0;
      value = value + l;
      uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
    }
  }
  iVar2 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
  if ((iVar2 == 0) &&
     ((uVar1 - 0x302a < 0xfffffff7 && uVar1 - 0x9fa6 < 0xffffae5a) && uVar1 != 0x3007)) {
    return 1;
  }
LAB_00144f40:
  _l = CONCAT44(space,l);
LAB_00144f55:
  do {
    value = value + l;
    uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
    if ((int)uVar1 < 0x100) {
      if ((((uVar1 - 0xc0 < 0x17) || ((uVar1 & 0xffffffdf) - 0x41 < 0x1a)) || (uVar1 - 0x30 < 10))
         || ((0xf7 < (int)uVar1 || (uVar1 - 0xd8 < 0x1f)))) goto LAB_00144f55;
    }
    else {
      iVar2 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
      if (((iVar2 != 0) || ((uVar1 - 0x3021 < 9 || uVar1 - 0x4e00 < 0x51a6) || uVar1 == 0x3007)) ||
         (iVar2 = xmlCharInRange(uVar1,&xmlIsDigitGroup), iVar2 != 0)) goto LAB_00144f55;
    }
    if ((uVar1 - 0x2d < 0x33) && ((0x4000000000003U >> ((ulong)(uVar1 - 0x2d) & 0x3f) & 1) != 0))
    goto LAB_00144f55;
    if ((int)uVar1 < 0x100) {
      uVar3 = (uint)(uVar1 == 0xb7);
    }
    else {
      iVar2 = xmlCharInRange(uVar1,&xmlIsCombiningGroup);
      if (iVar2 != 0) goto LAB_00144f55;
      uVar3 = xmlCharInRange(uVar1,&xmlIsExtenderGroup);
    }
  } while (uVar3 != 0);
  if (uVar1 == 0x3a) {
    value = value + l;
    uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
    if ((int)uVar1 < 0x100) {
      if ((((0x16 < uVar1 - 0xc0) && (0x19 < (uVar1 & 0xffffffdf) - 0x41)) && (uVar1 != 0x5f)) &&
         (((int)uVar1 < 0xf8 && (0x1e < uVar1 - 0xd8)))) {
        return 1;
      }
    }
    else {
      iVar2 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
      if ((iVar2 == 0) &&
         ((uVar1 - 0x302a < 0xfffffff7 && uVar1 - 0x9fa6 < 0xffffae5a) && uVar1 != 0x3007)) {
        return 1;
      }
    }
LAB_00145126:
    do {
      value = value + l;
      uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
      if ((int)uVar1 < 0x100) {
        if ((((uVar1 - 0xc0 < 0x17) || ((uVar1 & 0xffffffdf) - 0x41 < 0x1a)) || (uVar1 - 0x30 < 10))
           || ((0xf7 < (int)uVar1 || (uVar1 - 0xd8 < 0x1f)))) goto LAB_00145126;
      }
      else {
        iVar2 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
        if (((iVar2 != 0) || ((uVar1 - 0x3021 < 9 || uVar1 - 0x4e00 < 0x51a6) || uVar1 == 0x3007))
           || (iVar2 = xmlCharInRange(uVar1,&xmlIsDigitGroup), iVar2 != 0)) goto LAB_00145126;
      }
      if ((uVar1 - 0x2d < 0x33) && ((0x4000000000003U >> ((ulong)(uVar1 - 0x2d) & 0x3f) & 1) != 0))
      goto LAB_00145126;
      if ((int)uVar1 < 0x100) {
        uVar3 = (uint)(uVar1 == 0xb7);
      }
      else {
        iVar2 = xmlCharInRange(uVar1,&xmlIsCombiningGroup);
        if (iVar2 != 0) goto LAB_00145126;
        uVar3 = xmlCharInRange(uVar1,&xmlIsExtenderGroup);
      }
    } while (uVar3 != 0);
  }
  if (local_34 != 0) {
    while ((((int)uVar1 < 0x100 && (uVar1 < 0x21)) &&
           ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0))) {
      value = value + l;
      uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
    }
  }
  return (uint)(uVar1 != 0);
}

Assistant:

int
xmlValidateQName(const xmlChar *value, int space) {
    const xmlChar *cur = value;
    int c,l;

    if (value == NULL)
        return(-1);
    /*
     * First quick algorithm for ASCII range
     */
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (((*cur >= 'a') && (*cur <= 'z')) || ((*cur >= 'A') && (*cur <= 'Z')) ||
	(*cur == '_'))
	cur++;
    else
	goto try_complex;
    while (((*cur >= 'a') && (*cur <= 'z')) ||
	   ((*cur >= 'A') && (*cur <= 'Z')) ||
	   ((*cur >= '0') && (*cur <= '9')) ||
	   (*cur == '_') || (*cur == '-') || (*cur == '.'))
	cur++;
    if (*cur == ':') {
	cur++;
	if (((*cur >= 'a') && (*cur <= 'z')) ||
	    ((*cur >= 'A') && (*cur <= 'Z')) ||
	    (*cur == '_'))
	    cur++;
	else
	    goto try_complex;
	while (((*cur >= 'a') && (*cur <= 'z')) ||
	       ((*cur >= 'A') && (*cur <= 'Z')) ||
	       ((*cur >= '0') && (*cur <= '9')) ||
	       (*cur == '_') || (*cur == '-') || (*cur == '.'))
	    cur++;
    }
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == 0)
	return(0);

try_complex:
    /*
     * Second check for chars outside the ASCII range
     */
    cur = value;
    c = CUR_SCHAR(cur, l);
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if ((!IS_LETTER(c)) && (c != '_'))
	return(1);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	   (c == '-') || (c == '_') || IS_COMBINING(c) ||
	   IS_EXTENDER(c)) {
	cur += l;
	c = CUR_SCHAR(cur, l);
    }
    if (c == ':') {
	cur += l;
	c = CUR_SCHAR(cur, l);
	if ((!IS_LETTER(c)) && (c != '_'))
	    return(1);
	cur += l;
	c = CUR_SCHAR(cur, l);
	while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	       (c == '-') || (c == '_') || IS_COMBINING(c) ||
	       IS_EXTENDER(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (c != 0)
	return(1);
    return(0);
}